

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

void __thiscall Json::addToHolder(Json *this,string *s)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  _Alloc_hider __nptr;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substring;
  undefined1 local_100 [32];
  _Base_ptr local_e0;
  _Storage local_d8;
  int local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_80;
  long *local_50 [2];
  long local_40 [2];
  
  lVar8 = -1;
  do {
    lVar3 = lVar8 + 1;
    lVar8 = lVar8 + 1;
  } while ((s->_M_dataplus)._M_p[lVar3] == ' ');
  std::__cxx11::string::substr((ulong)local_50,(ulong)s);
  std::__cxx11::string::find((char)s,0x3a);
  std::__cxx11::string::substr((ulong)&local_c0,(ulong)local_50);
  do {
  } while (local_c0._M_dataplus._M_p[local_c0._M_string_length - 1] == ' ');
  std::__cxx11::string::substr((ulong)local_100,(ulong)&local_c0);
  std::__cxx11::string::operator=((string *)&local_c0,(string *)local_100);
  pcVar2 = local_100 + 0x10;
  if ((char *)local_100._0_8_ != pcVar2) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  std::__cxx11::string::find((char)s,0x3a);
  std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_50);
  lVar8 = 0;
  do {
    pcVar1 = (s->_M_dataplus)._M_p + lVar8;
    lVar8 = lVar8 + 1;
  } while (*pcVar1 == ' ');
  std::__cxx11::string::substr((ulong)local_100,(ulong)&local_a0);
  std::__cxx11::string::operator=((string *)&local_a0,(string *)local_100);
  if ((char *)local_100._0_8_ != pcVar2) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if (*local_a0._M_dataplus._M_p == '\"') {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_a0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                *)local_100,&local_c0,&local_80.first);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                        *)local_100);
    if (local_e0 != (_Base_ptr)0x0) {
      (*(code *)local_e0)(3,&local_e0,0);
      local_e0 = (_Base_ptr)0x0;
    }
    if ((char *)local_100._0_8_ != pcVar2) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    local_100._16_8_ = local_80.first.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.first._M_dataplus._M_p == &local_80.first.field_2) goto LAB_0010fd89;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_a0);
    if (iVar4 == 0) {
      local_100._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
      local_e0 = (_Base_ptr)std::any::_Manager_internal<bool>::_S_manage;
      local_d8 = (_Storage)0x1;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                  *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                          *)local_100);
      if (local_e0 != (_Base_ptr)0x0) {
        (*(code *)local_e0)(3,&local_e0,0);
LAB_0010fd69:
        local_e0 = (_Base_ptr)0x0;
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_a0);
      __nptr._M_p = local_a0._M_dataplus._M_p;
      if (iVar4 == 0) {
        local_100._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_100,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        local_e0 = (_Base_ptr)std::any::_Manager_internal<bool>::_S_manage;
        local_d8._M_ptr = (void *)0x0;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                    *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                            *)local_100);
        if (local_e0 != (_Base_ptr)0x0) {
          (*(code *)local_e0)(3,&local_e0,0);
          goto LAB_0010fd69;
        }
      }
      else {
        if (9 < (int)*local_a0._M_dataplus._M_p - 0x30U) {
          Json((Json *)local_100,&local_a0);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Json,_true>
                    (&local_80,&local_c0,(Json *)local_100);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                      *)this,&local_80);
          if (local_80.second._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_80.second._M_manager)(_Op_destroy,&local_80.second,(_Arg *)0x0);
            local_80.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
            operator_delete(local_80.first._M_dataplus._M_p,
                            local_80.first.field_2._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                       *)local_100);
          goto LAB_0010fd89;
        }
        piVar5 = __errno_location();
        local_c4 = *piVar5;
        *piVar5 = 0;
        uVar6 = strtol(__nptr._M_p,(char **)&local_80,10);
        if (local_80.first._M_dataplus._M_p == __nptr._M_p) {
          std::__throw_invalid_argument("stoi");
LAB_0010fe8e:
          uVar7 = std::__throw_out_of_range("stoi");
          __clang_call_terminate(uVar7);
        }
        if (((long)(int)uVar6 != uVar6) || (*piVar5 == 0x22)) goto LAB_0010fe8e;
        if (*piVar5 == 0) {
          *piVar5 = local_c4;
        }
        local_100._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_100,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        local_e0 = (_Base_ptr)std::any::_Manager_internal<int>::_S_manage;
        local_d8._M_ptr = (void *)(uVar6 & 0xffffffff);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                    *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                            *)local_100);
        if (local_e0 != (_Base_ptr)0x0) {
          (*(code *)local_e0)(3,&local_e0,0);
          goto LAB_0010fd69;
        }
      }
    }
    local_80.first._M_dataplus._M_p = (pointer)local_100._0_8_;
    if ((char *)local_100._0_8_ == pcVar2) goto LAB_0010fd89;
  }
  operator_delete(local_80.first._M_dataplus._M_p,local_100._16_8_ + 1);
LAB_0010fd89:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void Json::addToHolder(const std::string& s) {
    std::size_t offset = 0;
    while (s[offset] == ' ') offset++;
    auto substring = s.substr(offset);
    auto key = substring.substr(1, s.find_first_of(':')-1);
    offset = key.length() - 1;
    while (key[key.length() - 1] == ' ') offset--;
    key = key.substr(0, offset);
    auto value = substring.substr(s.find_first_of(':'));
    offset = 0;
    while (s[offset] == ' ') offset++;
    value = value.substr(offset + 1);
    offset = value.length() - 1;
    while (value[offset] == ' ') offset--;
    if (value[0] == '"') {
        holder.insert(holderPair(key, value.substr(1, value.length() - 2)));
    } else if (value == "true") {
        holder.insert(holderPair(key, true));
    } else if (value == "false") {
        holder.insert(holderPair(key, false));
    } else if (isdigit(value[0])) {
        holder.insert(holderPair(key, std::stoi(value)));
    } else {
        holder.insert(holderPair(key, Json(value)));
    }
}